

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O0

BOOL __thiscall Js::ModuleRoot::EnsureProperty(ModuleRoot *this,PropertyId propertyId)

{
  BOOL BVar1;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar2;
  PropertyId propertyId_local;
  ModuleRoot *this_local;
  
  BVar1 = RootObjectBase::HasOwnPropertyCheckNoRedecl(&this->super_RootObjectBase,propertyId);
  if (BVar1 == 0) {
    this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    pRVar2 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1a])
              (this,(ulong)(uint)propertyId,pRVar2,0x50,0);
  }
  return 1;
}

Assistant:

BOOL ModuleRoot::EnsureProperty(PropertyId propertyId)
    {
        if (!RootObjectBase::HasOwnPropertyCheckNoRedecl(propertyId))
        {
            // Cannot pass the extra PropertyOperation_PreInit flag, because module root uses SetSlot directly from
            // SetRootProperty. If the property is not yet initialized SetSlot will (correctly) assert.
            this->InitProperty(propertyId, this->GetLibrary()->GetUndefined(), (PropertyOperationFlags)(PropertyOperation_SpecialValue | PropertyOperation_NonFixedValue));
        }
        return true;
    }